

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
JsUtil::
List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
::
Copy<JsUtil::List<NativeOffsetInlineeFramePair,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
          (List<NativeOffsetInlineeFramePair,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
           *this,List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list)

{
  ulong uVar1;
  int32 requiredCapacity;
  
  requiredCapacity =
       (list->
       super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>).
       count;
  if (0 < requiredCapacity) {
    List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray((List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)this,requiredCapacity);
    if ((0xfffffff < (ulong)*(uint *)(this + 0x20)) ||
       (uVar1 = (ulong)(uint)(list->
                             super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                             ).count, 0xfffffff < uVar1)) {
      Math::DefaultOverflowPolicy();
    }
    js_memcpy_s(*(void **)(this + 8),(ulong)*(uint *)(this + 0x20) << 4,
                (list->
                super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                ).buffer,uVar1 << 4);
    requiredCapacity =
         (list->
         super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>).
         count;
  }
  *(int32 *)(this + 0x10) = requiredCapacity;
  return;
}

Assistant:

void Copy(const U* list)
        {
            CompileAssert(sizeof(TElementType) == sizeof(typename U::TElementType));
            if (list->Count() > 0)
            {
                this->EnsureArray(list->Count());
                js_memcpy_s(this->buffer, UInt32Math::Mul(sizeof(TElementType), this->length), list->GetBuffer(), UInt32Math::Mul(sizeof(TElementType), list->Count()));
            }
            this->count = list->Count();
        }